

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsedscene.cpp
# Opt level: O2

void __thiscall
pbrt::FormattingScene::TransformTimes(FormattingScene *this,Float start,Float end,FileLoc loc)

{
  Float local_40;
  Float local_3c;
  string local_38;
  
  local_40 = end;
  local_3c = start;
  indent_abi_cxx11_(&local_38,this,0);
  Printf<std::__cxx11::string,float&,float&>
            ("%sTransformTimes %f %f\n",&local_38,&local_3c,&local_40);
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

void FormattingScene::TransformTimes(Float start, Float end, FileLoc loc) {
    Printf("%sTransformTimes %f %f\n", indent(), start, end);
}